

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

TestInfo *
testing::internal::MakeAndRegisterTestInfo
          (char *test_suite_name,char *name,char *type_param,char *value_param,
          CodeLocation *code_location,TypeId fixture_class_id,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc,TestFactoryBase *factory)

{
  CodeLocation *a_value_param;
  char *pcVar1;
  TestInfo *this;
  UnitTestImpl *this_00;
  CodeLocation local_b8;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_61;
  string local_60;
  TestInfo *local_40;
  TestInfo *test_info;
  TypeId fixture_class_id_local;
  CodeLocation *code_location_local;
  char *value_param_local;
  char *type_param_local;
  char *name_local;
  char *test_suite_name_local;
  
  test_info = (TestInfo *)fixture_class_id;
  fixture_class_id_local = code_location;
  code_location_local = (CodeLocation *)value_param;
  value_param_local = type_param;
  type_param_local = name;
  name_local = test_suite_name;
  this = (TestInfo *)operator_new(0x110);
  pcVar1 = name_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
  pcVar1 = type_param_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
  pcVar1 = value_param_local;
  a_value_param = code_location_local;
  CodeLocation::CodeLocation(&local_b8,code_location);
  TestInfo::TestInfo(this,&local_60,&local_88,pcVar1,(char *)a_value_param,&local_b8,test_info,
                     factory);
  CodeLocation::~CodeLocation(&local_b8);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  local_40 = this;
  this_00 = GetUnitTestImpl();
  UnitTestImpl::AddTestInfo(this_00,set_up_tc,tear_down_tc,local_40);
  return local_40;
}

Assistant:

TestInfo* MakeAndRegisterTestInfo(
    const char* test_suite_name, const char* name, const char* type_param,
    const char* value_param, CodeLocation code_location,
    TypeId fixture_class_id, SetUpTestSuiteFunc set_up_tc,
    TearDownTestSuiteFunc tear_down_tc, TestFactoryBase* factory) {
  TestInfo* const test_info =
      new TestInfo(test_suite_name, name, type_param, value_param,
                   code_location, fixture_class_id, factory);
  GetUnitTestImpl()->AddTestInfo(set_up_tc, tear_down_tc, test_info);
  return test_info;
}